

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O0

xmlEntityPtr
xmlCreateEntity(xmlDocPtr doc,xmlChar *name,int type,xmlChar *ExternalID,xmlChar *SystemID,
               xmlChar *content)

{
  int iVar1;
  xmlChar *pxVar2;
  _xmlNs *p_Var3;
  _xmlDtd *p_Var4;
  xmlEntityPtr ret;
  xmlChar *content_local;
  xmlChar *SystemID_local;
  xmlChar *ExternalID_local;
  int type_local;
  xmlChar *name_local;
  xmlDocPtr doc_local;
  
  doc_local = (xmlDocPtr)(*xmlMalloc)(0x90);
  if (doc_local == (xmlDocPtr)0x0) {
    return (xmlEntityPtr)0x0;
  }
  memset(doc_local,0,0x90);
  doc_local->doc = doc;
  doc_local->type = XML_ENTITY_DECL;
  *(int *)((long)&doc_local->extSubset + 4) = type;
  if ((doc == (xmlDocPtr)0x0) || (doc->dict == (_xmlDict *)0x0)) {
    pxVar2 = xmlStrdup(name);
    doc_local->name = (char *)pxVar2;
  }
  else {
    pxVar2 = xmlDictLookup(doc->dict,name,-1);
    doc_local->name = (char *)pxVar2;
  }
  if ((xmlChar *)doc_local->name == (xmlChar *)0x0) {
LAB_00132428:
    xmlFreeEntity((xmlEntityPtr)doc_local);
    doc_local = (xmlDocPtr)0x0;
  }
  else {
    if (ExternalID != (xmlChar *)0x0) {
      p_Var3 = (_xmlNs *)xmlStrdup(ExternalID);
      doc_local->oldNs = p_Var3;
      if (doc_local->oldNs == (_xmlNs *)0x0) goto LAB_00132428;
    }
    if (SystemID != (xmlChar *)0x0) {
      pxVar2 = xmlStrdup(SystemID);
      doc_local->version = pxVar2;
      if (doc_local->version == (xmlChar *)0x0) goto LAB_00132428;
    }
    if (content == (xmlChar *)0x0) {
      *(int *)&doc_local->extSubset = 0;
      doc_local->intSubset = (_xmlDtd *)0x0;
    }
    else {
      iVar1 = xmlStrlen(content);
      *(int *)&doc_local->extSubset = iVar1;
      p_Var4 = (_xmlDtd *)xmlStrndup(content,*(int *)&doc_local->extSubset);
      doc_local->intSubset = p_Var4;
      if (doc_local->intSubset == (_xmlDtd *)0x0) goto LAB_00132428;
    }
    doc_local->ids = (xmlChar *)0x0;
    *(xmlChar **)&doc_local->compression = (xmlChar *)0x0;
  }
  return (xmlEntityPtr)doc_local;
}

Assistant:

static xmlEntityPtr
xmlCreateEntity(xmlDocPtr doc, const xmlChar *name, int type,
	        const xmlChar *ExternalID, const xmlChar *SystemID,
	        const xmlChar *content) {
    xmlEntityPtr ret;

    ret = (xmlEntityPtr) xmlMalloc(sizeof(xmlEntity));
    if (ret == NULL)
	return(NULL);
    memset(ret, 0, sizeof(xmlEntity));
    ret->doc = doc;
    ret->type = XML_ENTITY_DECL;

    /*
     * fill the structure.
     */
    ret->etype = (xmlEntityType) type;
    if ((doc == NULL) || (doc->dict == NULL))
	ret->name = xmlStrdup(name);
    else
        ret->name = xmlDictLookup(doc->dict, name, -1);
    if (ret->name == NULL)
        goto error;
    if (ExternalID != NULL) {
        ret->ExternalID = xmlStrdup(ExternalID);
        if (ret->ExternalID == NULL)
            goto error;
    }
    if (SystemID != NULL) {
        ret->SystemID = xmlStrdup(SystemID);
        if (ret->SystemID == NULL)
            goto error;
    }
    if (content != NULL) {
        ret->length = xmlStrlen(content);
	ret->content = xmlStrndup(content, ret->length);
        if (ret->content == NULL)
            goto error;
     } else {
        ret->length = 0;
        ret->content = NULL;
    }
    ret->URI = NULL; /* to be computed by the layer knowing
			the defining entity */
    ret->orig = NULL;

    return(ret);

error:
    xmlFreeEntity(ret);
    return(NULL);
}